

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::destroy(FileStorage *this,int i)

{
  mapped_type *pmVar1;
  int in_EDX;
  int __type;
  CriticalMapAccessor accessor;
  FileRecord fr;
  int local_5c;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  size_t local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_5c = i;
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)local_58,(char *)&this->filenames_,in_EDX);
  pmVar1 = Catch::clara::std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[]((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                         *)local_58._0_8_,&local_5c);
  FileRecord::operator=((FileRecord *)local_40,pmVar1);
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::erase((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           *)local_58._0_8_,&local_5c);
  Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_58 + 8));
  io::utils::remove((char *)&local_38);
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)local_58,
             (char *)&this->current_size_,__type);
  *(long *)(_Rb_tree_impl<std::less<int>,_true> *)local_58._0_8_ =
       *(long *)(_Rb_tree_impl<std::less<int>,_true> *)local_58._0_8_ - (long)local_40;
  Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void  destroy(int i) override
      {
        FileRecord      fr;
        {
          CriticalMapAccessor accessor = filenames_.access();
          fr = (*accessor)[i];
          accessor->erase(i);
        }
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }